

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O0

void __thiscall Kgc::mark(Kgc *this,Value *v)

{
  ValueType VVar1;
  CompoundProc *cp;
  Cell *c;
  Value *v_local;
  Kgc *this_local;
  
  if (((((ulong)v & 1) != 1) && (((ulong)v & 2) != 2)) && (v->marked_ == 0)) {
    v->marked_ = 1;
    VVar1 = Value::type(v);
    if (VVar1 == CELL) {
      mark(this,(Value *)v[1]._vptr_Value);
      mark(this,*(Value **)&v[1].type_);
    }
    else {
      VVar1 = Value::type(v);
      if (VVar1 == COMP_PROC) {
        mark(this,(Value *)v[1]._vptr_Value);
        mark(this,*(Value **)&v[1].type_);
        mark(this,v[1].next_);
      }
    }
  }
  return;
}

Assistant:

void Kgc::mark(const Value *v)
{
    if (IS_INT(v) || IS_CHR(v)) return;
    if (v->marked_) return;
    
    v->marked_ = 1;
    if (v->type() == ValueType::CELL)
    {
        const Cell *c = static_cast<const Cell *>(v);
        mark(c->head_);
        mark(c->tail_);
    } else if (v->type() == ValueType::COMP_PROC)
    {
        const CompoundProc *cp = static_cast<const CompoundProc *>(v);
        mark(cp->parameters_);
        mark(cp->body_);
        mark(cp->env_);
    }
}